

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::lts_20240722::inlined_vector_internal::
AllocationTransaction<std::allocator<absl::lts_20240722::status_internal::Payload>_>::
~AllocationTransaction
          (AllocationTransaction<std::allocator<absl::lts_20240722::status_internal::Payload>_>
           *this)

{
  Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_> pointer;
  bool bVar1;
  allocator<absl::lts_20240722::status_internal::Payload> *allocator;
  Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_> *ppPVar2;
  SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_> *pSVar3;
  AllocationTransaction<std::allocator<absl::lts_20240722::status_internal::Payload>_> *this_local;
  
  bVar1 = DidAllocate(this);
  if (bVar1) {
    allocator = GetAllocator(this);
    ppPVar2 = GetData(this);
    pointer = *ppPVar2;
    pSVar3 = GetCapacity(this);
    MallocAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_false>::Deallocate
              (allocator,pointer,*pSVar3);
  }
  container_internal::
  CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_absl::lts_20240722::status_internal::Payload_*>
  ::~CompressedTuple(&this->allocator_data_);
  return;
}

Assistant:

~AllocationTransaction() {
    if (DidAllocate()) {
      MallocAdapter<A>::Deallocate(GetAllocator(), GetData(), GetCapacity());
    }
  }